

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server-ws.c
# Opt level: O1

int lws_process_ws_upgrade2(lws *wsi)

{
  char cVar1;
  lws_context *plVar2;
  void *pvVar3;
  lws_callback_function *plVar4;
  int iVar5;
  lws_check_basic_auth_results lVar6;
  lws_protocol_vhost_options *plVar7;
  _lws_websocket_related *p_Var8;
  char *pcVar9;
  char *ws_prot_basic_auth;
  char *local_38;
  
  plVar2 = wsi->context;
  cVar1 = wsi->tsi;
  local_38 = (char *)0x0;
  plVar7 = lws_vhost_protocol_options(wsi->vhost,wsi->protocol->name);
  if (((plVar7 != (lws_protocol_vhost_options *)0x0) &&
      (plVar7->options != (lws_protocol_vhost_options *)0x0)) &&
     (iVar5 = lws_pvo_get_str(plVar7->options,"basic-auth",&local_38), iVar5 == 0)) {
    _lws_log(8,"%s: ws upgrade requires basic auth\n","lws_process_ws_upgrade2");
    lVar6 = lws_check_basic_auth(wsi,local_38,0);
    if (lVar6 == LCBA_END_TRANSACTION) {
      lws_return_http_status(wsi,0x193,(char *)0x0);
      iVar5 = lws_http_transaction_completed(wsi);
      return iVar5;
    }
    if (lVar6 == LCBA_FAILED_AUTH) {
      iVar5 = lws_unauthorised_basic_auth(wsi);
      return iVar5;
    }
  }
  if ((wsi->field_0x2dc & 0x10) == 0) {
    lws_role_transition(wsi,0x20000000,LRS_ESTABLISHED,&role_ops_ws);
  }
  p_Var8 = (_lws_websocket_related *)lws_zalloc(0xc0,"ws struct");
  wsi->ws = p_Var8;
  if (p_Var8 == (_lws_websocket_related *)0x0) {
    pcVar9 = "OOM\n";
  }
  else {
    iVar5 = lws_hdr_total_length(wsi,WSI_TOKEN_VERSION);
    if (iVar5 != 0) {
      pcVar9 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_VERSION);
      iVar5 = atoi(pcVar9);
      wsi->ws->ietf_spec_revision = (uint8_t)iVar5;
    }
    iVar5 = lws_ensure_user_space(wsi);
    if (iVar5 == 0) {
      pvVar3 = wsi->user_space;
      plVar4 = wsi->protocol->callback;
      pcVar9 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_PROTOCOL);
      iVar5 = (*plVar4)(wsi,LWS_CALLBACK_FILTER_PROTOCOL_CONNECTION,pvVar3,pcVar9,0);
      if (iVar5 != 0) {
        pcVar9 = "User code denied connection\n";
        iVar5 = 2;
        goto LAB_00123059;
      }
      if (wsi->ws->ietf_spec_revision != '\r') {
        _lws_log(4,"Unknown client spec version %d\n");
        wsi->ws->ietf_spec_revision = '\r';
      }
      if ((wsi->field_0x2dc & 0x10) == 0) {
        _lws_log(0x20,"lws_parse calling handshake_04\n");
        iVar5 = handshake_0405(wsi->context,wsi);
        if (iVar5 == 0) {
LAB_001231e2:
          lws_server_init_wsi_for_ws(wsi);
          _lws_log(0x20,"accepted v%02d connection\n",(ulong)wsi->ws->ietf_spec_revision);
          _lws_log(8,"%s: %p: dropping ah on ws upgrade\n","lws_process_ws_upgrade2",wsi);
          lws_header_table_detach(wsi,1);
          return 0;
        }
        pcVar9 = "hs0405 has failed the connection\n";
      }
      else {
        iVar5 = lws_h2_ws_handshake(wsi);
        if (iVar5 == 0) {
          lws_role_transition(wsi,0x21000000,LRS_ESTABLISHED,&role_ops_ws);
          __lws_sul_insert(&plVar2->pt[cVar1].pt_sul_owner,&wsi->sul_validity,-1);
          goto LAB_001231e2;
        }
        pcVar9 = "h2 ws handshake failed\n";
      }
    }
    else {
      pcVar9 = "problem with user space\n";
    }
  }
  iVar5 = 4;
LAB_00123059:
  _lws_log(iVar5,pcVar9);
  return 1;
}

Assistant:

int
lws_process_ws_upgrade2(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	const struct lws_protocol_vhost_options *pvos = NULL;
	const char *ws_prot_basic_auth = NULL;

	/*
	 * Allow basic auth a look-in now we bound the wsi to the protocol.
	 *
	 * For vhost ws basic auth, it is "basic-auth": "path" as usual but
	 * applied to the protocol's entry in the vhost's "ws-protocols":
	 * section, as a pvo.
	 */

	pvos = lws_vhost_protocol_options(wsi->vhost, wsi->protocol->name);
	if (pvos && pvos->options &&
	    !lws_pvo_get_str((void *)pvos->options, "basic-auth",
			     &ws_prot_basic_auth)) {
		lwsl_info("%s: ws upgrade requires basic auth\n", __func__);
		switch (lws_check_basic_auth(wsi, ws_prot_basic_auth, LWSAUTHM_DEFAULT
						/* no callback based auth here */)) {
		case LCBA_CONTINUE:
			break;
		case LCBA_FAILED_AUTH:
			return lws_unauthorised_basic_auth(wsi);
		case LCBA_END_TRANSACTION:
			lws_return_http_status(wsi, HTTP_STATUS_FORBIDDEN, NULL);
			return lws_http_transaction_completed(wsi);
		}
	}

	/*
	 * We are upgrading to ws, so http/1.1 + h2 and keepalive + pipelined
	 * header considerations about keeping the ah around no longer apply.
	 *
	 * However it's common for the first ws protocol data to have been
	 * coalesced with the browser upgrade request and to already be in the
	 * ah rx buffer.
	 */

	lws_pt_lock(pt, __func__);

	if (!wsi->h2_stream_carries_ws)
		lws_role_transition(wsi, LWSIFR_SERVER, LRS_ESTABLISHED,
				    &role_ops_ws);

	lws_pt_unlock(pt);

	/* allocate the ws struct for the wsi */

	wsi->ws = lws_zalloc(sizeof(*wsi->ws), "ws struct");
	if (!wsi->ws) {
		lwsl_notice("OOM\n");
		return 1;
	}

	if (lws_hdr_total_length(wsi, WSI_TOKEN_VERSION))
		wsi->ws->ietf_spec_revision =
			       atoi(lws_hdr_simple_ptr(wsi, WSI_TOKEN_VERSION));

	/* allocate wsi->user storage */
	if (lws_ensure_user_space(wsi)) {
		lwsl_notice("problem with user space\n");
		return 1;
	}

	/*
	 * Give the user code a chance to study the request and
	 * have the opportunity to deny it
	 */
	if ((wsi->protocol->callback)(wsi,
			LWS_CALLBACK_FILTER_PROTOCOL_CONNECTION,
			wsi->user_space,
		      lws_hdr_simple_ptr(wsi, WSI_TOKEN_PROTOCOL), 0)) {
		lwsl_warn("User code denied connection\n");
		return 1;
	}

	/*
	 * Perform the handshake according to the protocol version the
	 * client announced
	 */

	switch (wsi->ws->ietf_spec_revision) {
	default:
		lwsl_notice("Unknown client spec version %d\n",
			  wsi->ws->ietf_spec_revision);
		wsi->ws->ietf_spec_revision = 13;
		//return 1;
		/* fallthru */
	case 13:
#if defined(LWS_WITH_HTTP2)
		if (wsi->h2_stream_carries_ws) {
			if (lws_h2_ws_handshake(wsi)) {
				lwsl_notice("h2 ws handshake failed\n");
				return 1;
			}
			lws_role_transition(wsi,
					    LWSIFR_SERVER | LWSIFR_P_ENCAP_H2,
					    LRS_ESTABLISHED, &role_ops_ws);

			/*
			 * There should be no validity checking since we
			 * are encapsulated in something else with its own
			 * validity checking
			 */

			__lws_sul_insert(&pt->pt_sul_owner, &wsi->sul_validity,
					 LWS_SET_TIMER_USEC_CANCEL);
		} else
#endif
		{
			lwsl_parser("lws_parse calling handshake_04\n");
			if (handshake_0405(wsi->context, wsi)) {
				lwsl_notice("hs0405 has failed the connection\n");
				return 1;
			}
		}
		break;
	}

	lws_server_init_wsi_for_ws(wsi);
	lwsl_parser("accepted v%02d connection\n", wsi->ws->ietf_spec_revision);

#if defined(LWS_WITH_ACCESS_LOG)
	{
		char *uptr = "unknown method", combo[128], dotstar[64];
		int l = 14, meth = lws_http_get_uri_and_method(wsi, &uptr, &l);

		if (wsi->h2_stream_carries_ws)
			wsi->http.request_version = HTTP_VERSION_2;

		wsi->http.access_log.response = 101;

		lws_strnncpy(dotstar, uptr, l, sizeof(dotstar));
		l = lws_snprintf(combo, sizeof(combo), "%s (%s)", dotstar,
				 wsi->protocol->name);

		if (meth < 0)
			meth = 0;
		lws_prepare_access_log_info(wsi, combo, l, meth);
		lws_access_log(wsi);
	}
#endif

	lwsl_info("%s: %p: dropping ah on ws upgrade\n", __func__, wsi);
	lws_header_table_detach(wsi, 1);

	return 0;
}